

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O3

void __thiscall
Memory::LargeHeapBlock::ScanInitialImplicitRoots(LargeHeapBlock *this,Recycler *recycler)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  LargeObjectHeader *this_00;
  size_t byteCount;
  uint index;
  LargeObjectHeader *obj;
  undefined8 *in_FS_OFFSET;
  
  if (recycler->enableScanImplicitRoots == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x439,"(recycler->enableScanImplicitRoots)",
                       "recycler->enableScanImplicitRoots");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  if (this->allocCount != 0) {
    index = 0;
    do {
      this_00 = GetHeaderByIndex(this,index);
      if ((this_00 != (LargeObjectHeader *)0x0) &&
         (bVar4 = LargeObjectHeader::GetAttributes(this_00,this->heapInfo->recycler->Cookie),
         (bVar4 & 0x20) == 0)) {
        obj = this_00 + 1;
        bVar3 = HeapBlockMap64::IsMarked(&recycler->heapBlockMap,obj);
        if (bVar3) {
          if (recycler->objectGraphDumper != (RecyclerObjectGraphDumper *)0x0) {
            RecyclerObjectGraphDumper::BeginDumpObject(recycler->objectGraphDumper,L"Implicit Root")
            ;
            if (recycler->objectGraphDumper != (RecyclerObjectGraphDumper *)0x0) {
              RecyclerObjectGraphDumper::DumpObjectReference(recycler->objectGraphDumper,obj,false);
              if (recycler->objectGraphDumper != (RecyclerObjectGraphDumper *)0x0) {
                RecyclerObjectGraphDumper::EndDumpObject(recycler->objectGraphDumper);
              }
            }
          }
          if ((this->pageHeapData == (PageHeapData *)0x0) ||
             (this->pageHeapData->pageHeapMode == PageHeapModeOff)) {
            byteCount = this_00->objectSize;
          }
          else {
            byteCount = this_00->objectSize & 0xfffffffffffffff8;
            if (byteCount == 0) goto LAB_00246c97;
          }
          Recycler::ScanObjectInlineInterior(recycler,(void **)obj,byteCount);
        }
      }
LAB_00246c97:
      index = index + 1;
    } while (index < this->allocCount);
  }
  return;
}

Assistant:

void
LargeHeapBlock::ScanInitialImplicitRoots(Recycler * recycler)
{
    Assert(recycler->enableScanImplicitRoots);
    const HeapBlockMap& heapBlockMap = recycler->heapBlockMap;
    for (uint objectIndex = 0; objectIndex < allocCount; objectIndex++)
    {
        // object is allocated during the concurrent mark or it is marked, do rescan
        LargeObjectHeader * header = this->GetHeaderByIndex(objectIndex);
        // check if the object index is not allocated
        if (header == nullptr)
        {
            continue;
        }

        // check whether the object is a leaf and doesn't need to be scanned
        if ((header->GetAttributes(this->heapInfo->recycler->Cookie) & LeafBit) != 0)
        {
            continue;
        }

        char * objectAddress = (char *)header->GetAddress();

        // it is not marked, don't scan implicit root
        if (!heapBlockMap.IsMarked(objectAddress))
        {
            continue;
        }

        // TODO: Assume scan interior?
        DUMP_IMPLICIT_ROOT(recycler, objectAddress);

#ifdef RECYCLER_PAGE_HEAP
        if (this->InPageHeapMode())
        {
            size_t objectSize = header->objectSize;
            // trim off the trailing part which is not a pointer
            objectSize = HeapInfo::RoundObjectSize(objectSize);
            if (objectSize > 0) // otherwise the object total size is less than a pointer size
            {
                recycler->ScanObjectInlineInterior((void **)objectAddress, objectSize);
            }
        }
        else
#endif
        {
            recycler->ScanObjectInlineInterior((void **)objectAddress, header->objectSize);
        }
    }
}